

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int binding;
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:37:26),_void>
  another_lambda;
  funcptr<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_demo_cpp:32:18),_void>
  lambda;
  funcptr<std::function<void_(int,_func_ptr::user_pointer)>,_void> fnobj;
  int local_8c;
  function<void_(func_ptr::user_pointer,_int)> local_88;
  function<void_(func_ptr::user_pointer,_int)> local_68;
  function<void_(int,_func_ptr::user_pointer)> local_48;
  function<void_(int,_func_ptr::user_pointer)> local_28;
  
  fake_clib_func(func_ptr::funcptr::operator_cast_to_function_pointer,test);
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88.super__Function_base._M_functor._M_unused._M_object = test;
  local_88._M_invoker =
       std::
       _Function_handler<void_(int,_func_ptr::user_pointer),_void_(*)(int,_func_ptr::user_pointer)>
       ::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int,_func_ptr::user_pointer),_void_(*)(int,_func_ptr::user_pointer)>
       ::_M_manager;
  std::function<void_(int,_func_ptr::user_pointer)>::function
            (&local_28,(function<void_(int,_func_ptr::user_pointer)> *)&local_88);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  fake_clib_func(func_ptr::funcptr::operator_cast_to_function_pointer,&local_28);
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88._M_invoker =
       std::
       _Function_handler<void_(int,_func_ptr::user_pointer),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18)>
       ::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int,_func_ptr::user_pointer),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:32:18)>
       ::_M_manager;
  local_88.super__Function_base._M_functor._M_unused._M_object = &local_8c;
  std::function<void_(int,_func_ptr::user_pointer)>::function
            (&local_48,(function<void_(int,_func_ptr::user_pointer)> *)&local_88);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  fake_clib_func(func_ptr::funcptr::operator_cast_to_function_pointer,&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8c);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_88.super__Function_base._M_functor._8_8_ = 0;
  local_88._M_invoker =
       std::
       _Function_handler<void_(func_ptr::user_pointer,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26)>
       ::_M_invoke;
  local_88.super__Function_base._M_manager =
       std::
       _Function_handler<void_(func_ptr::user_pointer,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/demo.cpp:37:26)>
       ::_M_manager;
  local_88.super__Function_base._M_functor._M_unused._M_object = &local_8c;
  std::function<void_(func_ptr::user_pointer,_int)>::function(&local_68,&local_88);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  another_clib_func(func_ptr::funcptr::operator_cast_to_function_pointer,&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8c);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  std::_Function_base::~_Function_base(&local_28.super__Function_base);
  return 0;
}

Assistant:

int main() {
  funcptr fn{test};
  fake_clib_func(fn, fn.holder());

  funcptr fnobj{std::function<void(int, user_pointer)>{test}};
  fake_clib_func(fnobj, fnobj.holder());

  int binding;

  funcptr lambda{[&](int input, user_pointer) { binding = input; }};
  fake_clib_func(lambda, lambda.holder());

  std::cout << "[main] got " << binding << std::endl;

  funcptr another_lambda{[&](user_pointer, int input) { binding = input; }};
  another_clib_func(another_lambda, another_lambda.holder());

  std::cout << "[main] got " << binding << std::endl;
}